

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

void commit_h_x4(uint8_t **digest,commitments_t *C,picnic_instance_t *params)

{
  size_t i;
  ulong uVar1;
  hash_context_x4 ctx;
  hash_context_x4 local_360;
  
  hash_init_x4(&local_360,(ulong)params->digest_size);
  for (uVar1 = 0; uVar1 < params->num_MPC_parties; uVar1 = uVar1 + 1) {
    hash_update_x4_4(&local_360,C->hashes[uVar1],C[1].hashes[uVar1],C[2].hashes[uVar1],
                     C[3].hashes[uVar1],(ulong)params->digest_size);
  }
  hash_final_x4(&local_360);
  hash_squeeze_x4(&local_360,digest,(ulong)params->digest_size);
  return;
}

Assistant:

static void commit_h_x4(uint8_t** digest, const commitments_t* C, const picnic_instance_t* params) {
  hash_context_x4 ctx;

  hash_init_x4(&ctx, params->digest_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    hash_update_x4_4(&ctx, C[0].hashes[i], C[1].hashes[i], C[2].hashes[i], C[3].hashes[i],
                     params->digest_size);
  }
  hash_final_x4(&ctx);
  hash_squeeze_x4(&ctx, digest, params->digest_size);
  hash_clear_x4(&ctx);
}